

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCursesStringWidget.cxx
# Opt level: O0

void __thiscall
cmCursesStringWidget::cmCursesStringWidget
          (cmCursesStringWidget *this,int width,int height,int left,int top)

{
  int top_local;
  int left_local;
  int height_local;
  int width_local;
  cmCursesStringWidget *this_local;
  
  cmCursesWidget::cmCursesWidget(&this->super_cmCursesWidget,width,height,left,top);
  (this->super_cmCursesWidget)._vptr_cmCursesWidget =
       (_func_int **)&PTR__cmCursesStringWidget_00a77a58;
  (this->super_cmCursesWidget).field_0x3c = 0;
  (this->super_cmCursesWidget).Type = STRING;
  set_field_fore((this->super_cmCursesWidget).Field,0);
  set_field_back((this->super_cmCursesWidget).Field,0x10000);
  field_opts_off((this->super_cmCursesWidget).Field,0x200);
  return;
}

Assistant:

cmCursesStringWidget::cmCursesStringWidget(int width, int height,
                                           int left, int top) :
  cmCursesWidget(width, height, left, top)
{
  this->InEdit = false;
  this->Type = cmState::STRING;
  set_field_fore(this->Field,  A_NORMAL);
  set_field_back(this->Field,  A_STANDOUT);
  field_opts_off(this->Field,  O_STATIC);
}